

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  byte bVar2;
  stbi__context *psVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  stbi_uc *psVar12;
  long lVar13;
  long lVar14;
  stbi_uc *psVar15;
  uint uVar16;
  stbi__uint32 sVar17;
  stbi_uc *psVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  stbi_uc *__dest;
  uint uVar26;
  int iVar27;
  byte bVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  byte *pbVar36;
  uint uVar37;
  bool bVar38;
  ulong local_c8;
  ulong local_58;
  ulong uVar28;
  
  bVar38 = depth == 0x10;
  uVar6 = x * out_n;
  uVar7 = uVar6 << bVar38;
  psVar3 = a->s;
  iVar19 = psVar3->img_n;
  uVar8 = iVar19 << bVar38;
  if (iVar19 + 1 != out_n && iVar19 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                  ,0xfb2,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar12 = (stbi_uc *)malloc((ulong)((out_n << bVar38) * y * x));
  a->out = psVar12;
  if (psVar12 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar9 = iVar19 * x;
    uVar26 = iVar9 * depth + 7U >> 3;
    uVar28 = (ulong)uVar26;
    uVar10 = (uVar26 + 1) * y;
    if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
      if (uVar10 == raw_len) {
LAB_0011e61a:
        lVar13 = (long)iVar19;
        if (y != 0) {
          lVar30 = -(ulong)uVar7;
          lVar35 = (long)(out_n << bVar38);
          iVar11 = x - 1;
          lVar14 = -lVar35;
          uVar10 = 0;
          local_c8 = 0;
          local_58 = (ulong)x;
          do {
            uVar20 = (ulong)uVar10;
            pbVar25 = raw + 1;
            bVar4 = *raw;
            uVar32 = (ulong)bVar4;
            if (uVar32 < 5) {
              psVar12 = a->out;
              psVar18 = psVar12 + uVar7 * (int)local_c8;
              psVar15 = psVar18;
              if (depth < 8) {
                if (x < uVar26) {
                  __assert_fail("img_width_bytes <= x",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                                ,0xfc7,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                psVar15 = psVar18 + (uVar6 - uVar26);
                uVar8 = 1;
                local_58 = uVar28;
              }
              if (local_c8 == 0) {
                uVar32 = (ulong)""[uVar32];
              }
              if (0 < (int)uVar8) {
                uVar31 = 0;
                do {
                  switch(uVar32) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar5 = pbVar25[uVar31];
                    goto LAB_0011e7b7;
                  case 2:
                  case 4:
                    bVar5 = psVar12[uVar31 + uVar20 + lVar30];
                    break;
                  case 3:
                    bVar5 = psVar12[uVar31 + uVar20 + lVar30] >> 1;
                    break;
                  default:
                    goto switchD_0011e79e_default;
                  }
                  bVar5 = bVar5 + pbVar25[uVar31];
LAB_0011e7b7:
                  psVar15[uVar31] = bVar5;
switchD_0011e79e_default:
                  uVar31 = uVar31 + 1;
                } while (uVar8 != uVar31);
              }
              if (depth == 8) {
                lVar22 = (long)out_n;
                lVar21 = lVar13;
                if (iVar19 != out_n) {
                  psVar15[lVar13] = 0xff;
                }
LAB_0011e827:
                pbVar25 = pbVar25 + lVar21;
              }
              else {
                if (depth == 0x10) {
                  lVar21 = (long)(int)uVar8;
                  lVar22 = lVar35;
                  if (iVar19 != out_n) {
                    (psVar15 + lVar21)[0] = 0xff;
                    (psVar15 + lVar21)[1] = 0xff;
                  }
                  goto LAB_0011e827;
                }
                pbVar25 = raw + 2;
                lVar22 = 1;
              }
              __dest = psVar15 + lVar22;
              if (depth < 8 || iVar19 == out_n) {
                uVar16 = ((int)local_58 + -1) * uVar8;
                switch(uVar32) {
                case 0:
                  memcpy(__dest,pbVar25,(long)(int)uVar16);
                  break;
                case 1:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      __dest[uVar32] = psVar15[uVar32 + (lVar22 - (int)uVar8)] + pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      __dest[uVar32] = psVar12[uVar32 + lVar22 + uVar20 + lVar30] + pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      __dest[uVar32] =
                           (char)((uint)psVar15[uVar32 + (lVar22 - (int)uVar8)] +
                                  (uint)psVar12[uVar32 + lVar22 + uVar20 + lVar30] >> 1) +
                           pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      bVar5 = psVar15[uVar32 + (lVar22 - (int)uVar8)];
                      bVar2 = psVar12[uVar32 + lVar22 + uVar20 + lVar30];
                      bVar29 = psVar12[uVar32 + ((lVar22 + uVar20) - (long)(int)uVar8) + lVar30];
                      iVar33 = ((uint)bVar2 + (uint)bVar5) - (uint)bVar29;
                      uVar23 = iVar33 - (uint)bVar5;
                      uVar24 = -uVar23;
                      if (0 < (int)uVar23) {
                        uVar24 = uVar23;
                      }
                      uVar37 = iVar33 - (uint)bVar2;
                      uVar23 = -uVar37;
                      if (0 < (int)uVar37) {
                        uVar23 = uVar37;
                      }
                      uVar34 = iVar33 - (uint)bVar29;
                      uVar37 = -uVar34;
                      if (0 < (int)uVar34) {
                        uVar37 = uVar34;
                      }
                      if (uVar23 <= uVar37) {
                        bVar29 = bVar2;
                      }
                      if (uVar37 < uVar24) {
                        bVar5 = bVar29;
                      }
                      if (uVar23 < uVar24) {
                        bVar5 = bVar29;
                      }
                      __dest[uVar32] = bVar5 + pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      __dest[uVar32] =
                           (psVar15[uVar32 + (lVar22 - (int)uVar8)] >> 1) + pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar16) {
                    uVar32 = 0;
                    do {
                      __dest[uVar32] = psVar15[uVar32 + (lVar22 - (int)uVar8)] + pbVar25[uVar32];
                      uVar32 = uVar32 + 1;
                    } while (uVar16 != uVar32);
                  }
                }
                pbVar25 = pbVar25 + (int)uVar16;
              }
              else {
                if (iVar19 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                                ,0x1004,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if ((byte)uVar32 < 7) {
                  psVar18 = psVar18 + lVar22 + lVar30;
                  switch(uVar32) {
                  case 0:
                    if (iVar11 != 0) {
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] = pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 1:
                    if (iVar11 != 0) {
                      psVar15 = psVar15 + lVar22 + lVar14;
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] = psVar15[uVar32] + pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar15 = psVar15 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 2:
                    if (iVar11 != 0) {
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] = psVar18[uVar32] + pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar18 = psVar18 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 3:
                    if (iVar11 != 0) {
                      psVar15 = psVar15 + lVar22 + lVar14;
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] =
                                 (char)((uint)psVar15[uVar32] + (uint)psVar18[uVar32] >> 1) +
                                 pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar18 = psVar18 + lVar35;
                        psVar15 = psVar15 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 4:
                    if (iVar11 != 0) {
                      psVar15 = psVar15 + lVar22 + lVar14;
                      psVar12 = psVar12 + lVar22 + uVar20 + (lVar14 - (ulong)uVar7);
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            bVar5 = psVar15[uVar32];
                            bVar2 = psVar18[uVar32];
                            bVar29 = psVar12[uVar32];
                            iVar27 = ((uint)bVar2 + (uint)bVar5) - (uint)bVar29;
                            uVar24 = iVar27 - (uint)bVar5;
                            uVar16 = -uVar24;
                            if (0 < (int)uVar24) {
                              uVar16 = uVar24;
                            }
                            uVar23 = iVar27 - (uint)bVar2;
                            uVar24 = -uVar23;
                            if (0 < (int)uVar23) {
                              uVar24 = uVar23;
                            }
                            uVar37 = iVar27 - (uint)bVar29;
                            uVar23 = -uVar37;
                            if (0 < (int)uVar37) {
                              uVar23 = uVar37;
                            }
                            if (uVar24 <= uVar23) {
                              bVar29 = bVar2;
                            }
                            if (uVar23 < uVar16) {
                              bVar5 = bVar29;
                            }
                            if (uVar24 < uVar16) {
                              bVar5 = bVar29;
                            }
                            __dest[uVar32] = bVar5 + pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar18 = psVar18 + lVar35;
                        psVar15 = psVar15 + lVar35;
                        psVar12 = psVar12 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 5:
                    if (iVar11 != 0) {
                      psVar15 = psVar15 + lVar22 + lVar14;
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] = (psVar15[uVar32] >> 1) + pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar15 = psVar15 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                    break;
                  case 6:
                    if (iVar11 != 0) {
                      psVar15 = psVar15 + lVar22 + lVar14;
                      iVar33 = iVar11;
                      do {
                        if (0 < (int)uVar8) {
                          uVar32 = 0;
                          do {
                            __dest[uVar32] = psVar15[uVar32] + pbVar25[uVar32];
                            uVar32 = uVar32 + 1;
                          } while (uVar8 != uVar32);
                        }
                        __dest[(int)uVar8] = 0xff;
                        pbVar25 = pbVar25 + (int)uVar8;
                        __dest = __dest + lVar35;
                        psVar15 = psVar15 + lVar35;
                        iVar33 = iVar33 + -1;
                      } while (iVar33 != 0);
                    }
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar12 = a->out + (long)(int)uVar8 + uVar20 + 1;
                  sVar17 = x;
                  do {
                    *psVar12 = 0xff;
                    psVar12 = psVar12 + lVar35;
                    sVar17 = sVar17 - 1;
                  } while (sVar17 != 0);
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar4) {
              return 0;
            }
            local_c8 = local_c8 + 1;
            uVar10 = uVar10 + uVar7;
            raw = pbVar25;
          } while (local_c8 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          iVar19 = y * x * out_n;
          if (iVar19 != 0) {
            psVar12 = a->out;
            lVar13 = 0;
            do {
              puVar1 = (ushort *)(psVar12 + lVar13 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar13 = lVar13 + 1;
            } while (iVar19 != (int)lVar13);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar8 = x - 1;
        lVar13 = uVar6 - uVar28;
        lVar14 = (ulong)uVar8 + 1;
        uVar10 = 0;
        uVar32 = 0;
        do {
          bVar4 = 1;
          if (color == 0) {
            bVar4 = ""[depth];
          }
          psVar12 = a->out;
          pbVar36 = psVar12 + uVar7 * (int)uVar32;
          pbVar25 = pbVar36 + (uVar6 - uVar28);
          uVar20 = (ulong)uVar10;
          if (depth == 4) {
            iVar11 = iVar9;
            if (1 < iVar9) {
              psVar15 = psVar12 + lVar13;
              iVar33 = iVar9;
              do {
                psVar12[uVar20] = (psVar15[uVar20] >> 4) * bVar4;
                psVar12[uVar20 + 1] = (psVar15[uVar20] & 0xf) * bVar4;
                iVar11 = iVar33 + -2;
                psVar15 = psVar15 + 1;
                psVar12 = psVar12 + 2;
                bVar38 = 3 < iVar33;
                iVar33 = iVar11;
              } while (bVar38);
              pbVar25 = psVar15 + uVar20;
              pbVar36 = psVar12 + uVar20;
            }
            if (iVar11 == 1) {
              bVar5 = *pbVar25 >> 4;
LAB_0011f0c9:
              bVar4 = bVar5 * bVar4;
LAB_0011f0cc:
              *pbVar36 = bVar4;
            }
          }
          else if (depth == 2) {
            iVar11 = iVar9;
            if (3 < iVar9) {
              psVar15 = psVar12 + lVar13;
              iVar33 = iVar9;
              do {
                psVar12[uVar20] = (psVar15[uVar20] >> 6) * bVar4;
                psVar12[uVar20 + 1] = (psVar15[uVar20] >> 4 & 3) * bVar4;
                psVar12[uVar20 + 2] = (psVar15[uVar20] >> 2 & 3) * bVar4;
                psVar12[uVar20 + 3] = (psVar15[uVar20] & 3) * bVar4;
                iVar11 = iVar33 + -4;
                psVar15 = psVar15 + 1;
                psVar12 = psVar12 + 4;
                bVar38 = 7 < iVar33;
                iVar33 = iVar11;
              } while (bVar38);
              pbVar25 = psVar15 + uVar20;
              pbVar36 = psVar12 + uVar20;
            }
            if (0 < iVar11) {
              *pbVar36 = (*pbVar25 >> 6) * bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (1 < iVar11) {
              *pbVar36 = (*pbVar25 >> 4 & 3) * bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (iVar11 == 3) {
              bVar5 = *pbVar25 >> 2 & 3;
              goto LAB_0011f0c9;
            }
          }
          else if (depth == 1) {
            iVar11 = iVar9;
            if (7 < iVar9) {
              psVar15 = psVar12 + lVar13;
              iVar33 = iVar9;
              do {
                psVar12[uVar20] = (char)psVar15[uVar20] >> 7 & bVar4;
                psVar12[uVar20 + 1] = (char)(psVar15[uVar20] * '\x02') >> 7 & bVar4;
                psVar12[uVar20 + 2] = (char)(psVar15[uVar20] << 2) >> 7 & bVar4;
                psVar12[uVar20 + 3] = (char)(psVar15[uVar20] << 3) >> 7 & bVar4;
                psVar12[uVar20 + 4] = (char)(psVar15[uVar20] << 4) >> 7 & bVar4;
                psVar12[uVar20 + 5] = (char)(psVar15[uVar20] << 5) >> 7 & bVar4;
                psVar12[uVar20 + 6] = (char)(psVar15[uVar20] << 6) >> 7 & bVar4;
                bVar5 = bVar4;
                if ((psVar15[uVar20] & 1) == 0) {
                  bVar5 = 0;
                }
                psVar12[uVar20 + 7] = bVar5;
                iVar11 = iVar33 + -8;
                psVar15 = psVar15 + 1;
                psVar12 = psVar12 + 8;
                bVar38 = 0xf < iVar33;
                iVar33 = iVar11;
              } while (bVar38);
              pbVar25 = psVar15 + uVar20;
              pbVar36 = psVar12 + uVar20;
            }
            if (0 < iVar11) {
              *pbVar36 = (char)*pbVar25 >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (1 < iVar11) {
              *pbVar36 = (char)(*pbVar25 * '\x02') >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (2 < iVar11) {
              *pbVar36 = (char)(*pbVar25 << 2) >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (3 < iVar11) {
              *pbVar36 = (char)(*pbVar25 << 3) >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (4 < iVar11) {
              *pbVar36 = (char)(*pbVar25 << 4) >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (5 < iVar11) {
              *pbVar36 = (char)(*pbVar25 << 5) >> 7 & bVar4;
              pbVar36 = pbVar36 + 1;
            }
            if (iVar11 == 7) {
              bVar4 = (char)(*pbVar25 << 6) >> 7 & bVar4;
              goto LAB_0011f0cc;
            }
          }
          if (iVar19 != out_n) {
            psVar12 = a->out;
            if (iVar19 == 1) {
              lVar30 = lVar14;
              if (-1 < (int)uVar8) {
                do {
                  psVar12[lVar30 * 2 + (uVar20 - 1)] = 0xff;
                  psVar12[lVar30 * 2 + (uVar20 - 2)] = psVar12[lVar30 + (uVar20 - 1)];
                  lVar35 = lVar30 + -1;
                  bVar38 = 0 < lVar30;
                  lVar30 = lVar35;
                } while (lVar35 != 0 && bVar38);
              }
            }
            else {
              if (iVar19 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                              ,0x105d,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar8) {
                psVar15 = psVar12 + (ulong)uVar8 * 3 + 2 + uVar20;
                lVar30 = lVar14;
                do {
                  psVar12[lVar30 * 4 + (uVar20 - 1)] = 0xff;
                  psVar12[lVar30 * 4 + (uVar20 - 2)] = *psVar15;
                  psVar12[lVar30 * 4 + (uVar20 - 3)] = psVar15[-1];
                  psVar12[lVar30 * 4 + (uVar20 - 4)] = psVar15[-2];
                  psVar15 = psVar15 + -3;
                  lVar35 = lVar30 + -1;
                  bVar38 = 0 < lVar30;
                  lVar30 = lVar35;
                } while (lVar35 != 0 && bVar38);
              }
            }
          }
          uVar32 = uVar32 + 1;
          uVar10 = uVar10 + uVar7;
          if (uVar32 == y) {
            return 1;
          }
        } while( true );
      }
    }
    else if (uVar10 <= raw_len) goto LAB_0011e61a;
    stbi__g_failure_reason = "not enough pixels";
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * output_bytes); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); break;
         }
         #undef CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            int q;
            // insert alpha = 255
            cur = a->out + stride*j;
            if (img_n == 1) {
               for (q=x-1; q >= 0; --q) {
                  cur[q*2+1] = 255;
                  cur[q*2+0] = cur[q];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (q=x-1; q >= 0; --q) {
                  cur[q*4+3] = 255;
                  cur[q*4+2] = cur[q*3+2];
                  cur[q*4+1] = cur[q*3+1];
                  cur[q*4+0] = cur[q*3+0];
               }
            }
         }
      }
   } else if (depth == 16) {
      // force the image data from big-endian to platform-native.
      // this is done in a separate pass due to the decoding relying
      // on the data being untouched, but could probably be done
      // per-line during decode if care is taken.
      stbi_uc *cur = a->out;
      stbi__uint16 *cur16 = (stbi__uint16*)cur;

      for(i=0; i < x*y*out_n; ++i,cur16++,cur+=2) {
         *cur16 = (cur[0] << 8) | cur[1];
      }
   }

   return 1;
}